

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_error_t apx_vm_serializer_queued_write_end(apx_vm_serializer_t *self)

{
  uint32_t value_size_00;
  apx_error_t retval;
  uint32_t value_size;
  apx_vm_serializer_t *self_local;
  
  if (self == (apx_vm_serializer_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else if (((self->queued_write_state).is_active & 1U) == 0) {
    self_local._4_4_ = 6;
  }
  else {
    (self->queued_write_state).is_active = false;
    value_size_00 = apx_vm_size_type_to_size((self->queued_write_state).size_type);
    self_local._4_4_ =
         write_dynamic_value_to_buffer
                   ((self->queued_write_state).length_ptr,
                    (self->queued_write_state).length_ptr + value_size_00,
                    (self->queued_write_state).current_length,value_size_00);
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_serializer_queued_write_end(apx_vm_serializer_t* self)
{
   if (self != NULL)
   {
      if (!self->queued_write_state.is_active)
      {
         return APX_INTERNAL_ERROR;
      }
      self->queued_write_state.is_active = false;
      uint32_t const value_size = apx_vm_size_type_to_size(self->queued_write_state.size_type);
      apx_error_t retval = write_dynamic_value_to_buffer(self->queued_write_state.length_ptr,
         self->queued_write_state.length_ptr + value_size, self->queued_write_state.current_length, value_size);
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}